

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O1

void Js::DynamicProfileInfo::DumpProfiledValue(char16 *name,CallSiteInfo *callSiteInfo,uint count)

{
  Type TVar1;
  code *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  char16_t *pcVar7;
  long lVar8;
  uint i;
  ulong uVar9;
  char local_148 [8];
  char returnTypeStr [256];
  
  if (count != 0) {
    Output::Print(L"    %-16s(%2d):",name);
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    returnTypeStr._248_8_ = ZEXT48(count);
    uVar9 = 0;
    do {
      pcVar7 = L" ";
      if ((uVar9 != 0) &&
         (uVar5 = (int)uVar9 * -0x33333333, pcVar7 = L" ",
         (uVar5 >> 1 | (uint)((uVar5 & 1) != 0) << 0x1f) < 0x1999999a)) {
        pcVar7 = L"\n                          ";
      }
      Output::Print(pcVar7);
      Output::Print(L"%2d:",uVar9 & 0xffffffff);
      if (*(short *)&callSiteInfo[uVar9].field_0x2 < 0) {
        Output::Print(L" poly");
        lVar8 = -4;
        do {
          if (*(int *)((long)callSiteInfo[uVar9].u + 0x10 + lVar8 * 4) != -4) {
            Output::Print(L" %4d:%4d",
                          (ulong)*(uint *)((long)callSiteInfo[uVar9].u + 0x20 + lVar8 * 4));
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0);
      }
      else {
        uVar5 = callSiteInfo[uVar9].u.functionData.sourceId;
        if (uVar5 == 0xfffffffc) {
          TVar1 = callSiteInfo[uVar9].u.functionData.functionId;
          if (TVar1 == 0xfffffffd) {
            pcVar7 = L"  !fn";
          }
          else if (TVar1 == 0xfffffffe) {
            pcVar7 = L"    x";
          }
          else {
            if (TVar1 != 0xffffffff) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar6 = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                          ,0x65b,"(false)","false");
              if (!bVar4) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              *puVar6 = 0;
              goto LAB_0097534e;
            }
            pcVar7 = L"  mix";
          }
LAB_009752ce:
          Output::Print(pcVar7);
        }
        else if (uVar5 == 0xfffffffe) {
          Output::Print(L" b%03d",(ulong)callSiteInfo[uVar9].u.functionData.functionId);
        }
        else {
          if (uVar5 == 0xffffffff) {
            pcVar7 = L" ????";
            goto LAB_009752ce;
          }
          Output::Print(L" %4d:%4d",(ulong)uVar5,
                        (ulong)callSiteInfo[uVar9].u.functionData.functionId);
        }
      }
LAB_0097534e:
      uVar3 = returnTypeStr._248_8_;
      uVar9 = uVar9 + 1;
    } while (uVar9 != returnTypeStr._248_8_);
    Output::Print(L"\n");
    Output::Print(L"    %-16s(%2d):",L"Callsite RetType",(ulong)count);
    uVar9 = 0;
    do {
      pcVar7 = L" ";
      if ((uVar9 != 0) &&
         (pcVar7 = L"\n                          ",
         (int)((uVar9 & 0xffffffff) / 10) * -10 + (int)uVar9 != 0)) {
        pcVar7 = L" ";
      }
      Output::Print(pcVar7);
      Output::Print(L"%2d:",uVar9 & 0xffffffff);
      ValueType::ToString(&callSiteInfo->returnType,(char (*) [256])local_148);
      Output::Print(L"  %S",(char (*) [256])local_148);
      uVar9 = uVar9 + 1;
      callSiteInfo = callSiteInfo + 1;
    } while (uVar3 != uVar9);
    Output::Print(L"\n");
  }
  return;
}

Assistant:

void DynamicProfileInfo::DumpProfiledValue(char16 const * name, CallSiteInfo * callSiteInfo, uint count)
    {
        if (count != 0)
        {
            Output::Print(_u("    %-16s(%2d):"), name, count);
            for (uint i = 0; i < count; i++)
            {
                Output::Print(i != 0 && (i % 10) == 0 ? _u("\n                          ") : _u(" "));
                Output::Print(_u("%2d:"), i);
                if (!callSiteInfo[i].isPolymorphic)
                {
                    switch (callSiteInfo[i].u.functionData.sourceId)
                    {
                    case NoSourceId:
                        Output::Print(_u(" ????"));
                        break;

                    case BuiltInSourceId:
                        Output::Print(_u(" b%03d"), callSiteInfo[i].u.functionData.functionId);
                        break;

                    case InvalidSourceId:
                        if (callSiteInfo[i].u.functionData.functionId == CallSiteMixed)
                        {
                            Output::Print(_u("  mix"));
                        }
                        else if (callSiteInfo[i].u.functionData.functionId == CallSiteCrossContext)
                        {
                            Output::Print(_u("    x"));
                        }
                        else if (callSiteInfo[i].u.functionData.functionId == CallSiteNonFunction)
                        {
                            Output::Print(_u("  !fn"));
                        }
                        else
                        {
                            Assert(false);
                        }
                        break;

                    default:
                        Output::Print(_u(" %4d:%4d"), callSiteInfo[i].u.functionData.sourceId, callSiteInfo[i].u.functionData.functionId);
                        break;
                    };
                }
                else
                {
                    Output::Print(_u(" poly"));
                    for (int j = 0; j < DynamicProfileInfo::maxPolymorphicInliningSize; j++)
                    {
                        if (callSiteInfo[i].u.polymorphicCallSiteInfo->functionIds[j] != CallSiteNoInfo)
                        {
                            Output::Print(_u(" %4d:%4d"), callSiteInfo[i].u.polymorphicCallSiteInfo->sourceIds[j], callSiteInfo[i].u.polymorphicCallSiteInfo->functionIds[j]);
                        }
                    }
                }
            }
            Output::Print(_u("\n"));

            Output::Print(_u("    %-16s(%2d):"), _u("Callsite RetType"), count);
            for (uint i = 0; i < count; i++)
            {
                Output::Print(i != 0 && (i % 10) == 0 ? _u("\n                          ") : _u(" "));
                Output::Print(_u("%2d:"), i);
                char returnTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
                callSiteInfo[i].returnType.ToString(returnTypeStr);
                Output::Print(_u("  %S"), returnTypeStr);
            }
            Output::Print(_u("\n"));
        }
    }